

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_critical_rate_simulation.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  unsigned_long num_frames_to_test;
  unsigned_long max_num_iter;
  pointer pcVar2;
  unsigned_long update_console_every_n_frames;
  ostream *poVar3;
  long lVar4;
  pointer puVar5;
  string *generalProgramDescriptionForHelpText;
  pointer pcVar6;
  pointer puVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> syndrome_size_success;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rate_adaption_file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> code_file_path;
  Parser parser;
  RateAdaptiveCode<unsigned_int> H;
  mt19937_64 rng;
  char local_b81;
  double local_b80;
  double local_b78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  string local_b18;
  size_t local_af8;
  undefined8 uStack_af0;
  Parser local_ae0;
  RateAdaptiveCode<unsigned_int> local_a70;
  undefined1 local_9f8 [2496];
  size_t local_38;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  generalProgramDescriptionForHelpText = &local_b18;
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)generalProgramDescriptionForHelpText,
             "Slepian-Wolf Critical Code Rate Simulator for Rate Adapted LDPC Codes\n\nIn a Slepian-Wolf coding setting, for a given codeword and noised codeword, there is a minimum coding rate at which the syndrome decoding succeeds.\nThis program determines the average minimum coding rate across many noised codewords."
             ,"");
  cli::Parser::Parser(&local_ae0,argc,argv,generalProgramDescriptionForHelpText);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  configure_parser(&local_ae0);
  bVar1 = cli::Parser::run(&local_ae0,(ostream *)&std::cout,(ostream *)&std::cerr);
  if (bVar1) {
    pcVar6 = local_9f8 + 0x10;
    local_9f8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"p","");
    local_b78 = cli::Parser::get<double>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar6) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"nf","");
    num_frames_to_test = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar6) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"i","");
    max_num_iter = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar6) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"s","");
    pcVar2 = (pointer)cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar6) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"upn","");
    update_console_every_n_frames = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar6) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"cp","");
    cli::Parser::get<std::__cxx11::string>(&local_b38,&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar6) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"rp","");
    cli::Parser::get<std::__cxx11::string>(&local_b58,&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar6) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
              (&local_a70,(CodeSimulationHelpers *)&local_b38,&local_b58,
               generalProgramDescriptionForHelpText);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"LDPC Code loaded from file: ",0x1c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b38._M_dataplus._M_p,local_b38._M_string_length)
    ;
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Rate adaption loaded from file: ",0x20);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b58._M_dataplus._M_p,local_b58._M_string_length)
    ;
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Code size: ",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," x ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Running FER decoding test on channel parameter p : ",0x33);
    poVar3 = std::ostream::_M_insert<double>(local_b78);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Max number decoder iterations: ",0x1f);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)max_num_iter);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of frames to simulate: ",0x1e);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PRNG seed: ",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar4 = 1;
    pcVar6 = pcVar2;
    do {
      pcVar6 = (pointer)(((ulong)pcVar6 >> 0x3e ^ (ulong)pcVar6) * 0x5851f42d4c957f2d + lVar4);
      *(pointer *)(local_9f8 + lVar4 * 8) = pcVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x138);
    local_38 = 0x138;
    local_9f8._0_8_ = pcVar2;
    std::chrono::_V2::steady_clock::now();
    run_simulation<LDPC4QKD::RateAdaptiveCode<unsigned_int>>
              (&local_b70,&local_a70,local_b78,num_frames_to_test,(mt19937_64 *)local_9f8,
               max_num_iter,update_console_every_n_frames);
    std::chrono::_V2::steady_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n\nDONE! Simulation time: ",0x19);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds.",9);
    local_b81 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_b81,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"all syndrome sizes:",0x13);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    puVar5 = local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar7 = local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        local_b81 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_b81,1);
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
    local_b80 = 0.0;
    if (local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_b80 = 0.0;
      puVar5 = local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_b80 = local_b80 +
                    ((double)CONCAT44(0x45300000,(int)(*puVar5 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)*puVar5) - 4503599627370496.0);
        puVar5 = puVar5 + 1;
      } while (puVar5 != local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Average syndrome size (out of ",0x1e);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," codewords tried): ",0x13);
    lVar4 = (long)local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_b70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    auVar9._8_4_ = (int)((long)local_b70.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_b70.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 0x23);
    auVar9._0_8_ = lVar4;
    auVar9._12_4_ = 0x45300000;
    local_b80 = local_b80 /
                ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    poVar3 = std::ostream::_M_insert<double>(local_b80);
    std::endl<char,std::char_traits<char>>(poVar3);
    local_af8 = local_a70.n_cols;
    uStack_af0 = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Average rate: ",0xe);
    auVar11._12_4_ = (undefined4)((ulong)uStack_af0 >> 0x20);
    auVar11._8_4_ = (int)(local_af8 >> 0x20);
    auVar11._0_8_ = local_af8;
    auVar10._8_8_ = auVar11._8_8_;
    auVar10._0_8_ = (double)CONCAT44(0x43300000,(int)local_af8);
    auVar12._0_12_ = auVar10._0_12_;
    auVar12._12_4_ = 0x45300000;
    local_b80 = local_b80 /
                ((auVar12._8_8_ - 1.9342813113834067e+25) + (auVar10._0_8_ - 4503599627370496.0));
    poVar3 = std::ostream::_M_insert<double>(local_b80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (inefficiency f = ",0x13);
    dVar8 = LDPC4QKD::CodeSimulationHelpers::h2<double>(local_b78);
    poVar3 = std::ostream::_M_insert<double>(local_b80 / dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(0);
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    // parse command line arguments
    cli::Parser parser(argc, argv, help_text);
    configure_parser(parser);
    parser.run_and_exit_if_error();

    auto p = parser.get<double>("p");
    auto num_frames_to_test = parser.get<std::size_t>("nf");
    auto max_bp_iter = parser.get<std::size_t>("i");
    auto rng_seed = parser.get<std::size_t>("s");
    auto update_console_every_n_frames = parser.get<std::size_t>("upn");
    auto code_file_path = parser.get<std::string>("cp");;
    auto rate_adaption_file_path = parser.get<std::string>("rp");;

    auto H = load_ldpc(code_file_path, rate_adaption_file_path);

    std::cout << std::endl;
    std::cout << "LDPC Code loaded from file: " << code_file_path << '\n';
    std::cout << "Rate adaption loaded from file: " << rate_adaption_file_path << '\n';
    std::cout << "Code size: " << H.get_n_rows_after_rate_adaption() << " x " << H.getNCols() << '\n';
    std::cout << "Running FER decoding test on channel parameter p : " << p << '\n';
    std::cout << "Max number decoder iterations: " << static_cast<int>(max_bp_iter) << '\n';
    std::cout << "Number of frames to simulate: " << num_frames_to_test << '\n';
    std::cout << "PRNG seed: " << rng_seed << '\n';
    std::cout << "\n" << std::endl;

    std::mt19937_64 rng(rng_seed);
    auto begin = std::chrono::steady_clock::now();

    auto syndrome_size_success = run_simulation(
            H, p, num_frames_to_test, rng,
            max_bp_iter, update_console_every_n_frames);

    auto now = std::chrono::steady_clock::now();
    std::cout << "\n\nDONE! Simulation time: " <<
              std::chrono::duration_cast<std::chrono::seconds>(now - begin).count() << " seconds." << '\n';


    std::cout << "all syndrome sizes:" << std::endl;
    for (auto s : syndrome_size_success) {
        std::cout << s << ' ';
    }
    std::cout << "\n\n";

    double avg_synd_size = avg(syndrome_size_success);
    std::cout << "Average syndrome size (out of " << num_frames_to_test << " codewords tried): " << avg_synd_size
              << std::endl;

    double avg_rate = avg_synd_size / static_cast<double>(H.getNCols());
    std::cout << "Average rate: " << avg_rate << " (inefficiency f = " << avg_rate / h2(p) << ")" << std::endl;
    exit(EXIT_SUCCESS);
}